

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O1

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::PendingQueryResult::LockContext(PendingQueryResult *this)

{
  char cVar1;
  InvalidInputException *this_00;
  long in_RSI;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long *)(in_RSI + 0x150) != 0) {
    shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x150));
    ClientContext::LockContext((ClientContext *)this);
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           this;
  }
  cVar1 = *(char *)(in_RSI + 200);
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  if (cVar1 != '\0') {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Attempting to execute an unsuccessful or closed pending query result","");
    InvalidInputException::InvalidInputException(this_00,&local_68);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Attempting to execute an unsuccessful or closed pending query result\nError: %s","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(in_RSI + 0xf8),
             *(long *)(in_RSI + 0x100) + *(long *)(in_RSI + 0xf8));
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ClientContextLock> PendingQueryResult::LockContext() {
	if (!context) {
		if (HasError()) {
			throw InvalidInputException(
			    "Attempting to execute an unsuccessful or closed pending query result\nError: %s", GetError());
		}
		throw InvalidInputException("Attempting to execute an unsuccessful or closed pending query result");
	}
	return context->LockContext();
}